

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

Value * __thiscall
optimization::common_expr_del::BlockNodes::convert_operand_to_value
          (Value *__return_storage_ptr__,BlockNodes *this,Operand *operand)

{
  variant_alternative_t<1UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar1;
  variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar2;
  
  if ((operand->
      super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      ._M_index == '\0') {
    pvVar2 = std::get<0ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>(operand);
    *(variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *)
     &__return_storage_ptr__->field_0x8 = *pvVar2;
    __return_storage_ptr__->field_0x18 = 0;
    (__return_storage_ptr__->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001dafa8;
    __return_storage_ptr__->shift = Lsl;
    __return_storage_ptr__->shift_amount = '\0';
  }
  else {
    pvVar1 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>(operand);
    mir::inst::Value::Value
              (__return_storage_ptr__,
               &((this->nodes).
                 super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pvVar1->id].
                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mainVar);
  }
  return __return_storage_ptr__;
}

Assistant:

mir::inst::Value convert_operand_to_value(Operand operand) {
    if (operand.index() == 0) {
      auto imm = std::get<int>(operand);
      return imm;
    } else {
      auto nodeId = std::get<NodeId>(operand);
      return nodes[nodeId.id]->mainVar;
    }
  }